

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O0

IntersectionData *
vera::intersection(IntersectionData *__return_storage_ptr__,Plane *_plane1,Plane *_plane2)

{
  float fVar1;
  length_type lVar2;
  float fVar3;
  float fVar4;
  vec3 vVar5;
  vec<3,_float,_(glm::qualifier)0> vVar6;
  IntersectionData *idata;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_180;
  vec<3,_float,_(glm::qualifier)0> local_178;
  vec<3,_float,_(glm::qualifier)0> local_168;
  vec<3,_float,_(glm::qualifier)0> local_158;
  vec<3,_float,_(glm::qualifier)0> local_148;
  vec<3,_float,_(glm::qualifier)0> local_138;
  vec<3,_float,_(glm::qualifier)0> local_128;
  vec<3,_float,_(glm::qualifier)0> local_118;
  vec<3,_float,_(glm::qualifier)0> local_108;
  vec3 anchor;
  float b;
  float a;
  float det;
  float offDiagonal;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_d8;
  vec<3,_float,_(glm::qualifier)0> local_c0;
  vec<3,_float,_(glm::qualifier)0> local_b0;
  vec<3,_float,_(glm::qualifier)0> local_a0;
  vec3 local_90;
  vec<3,_float,_(glm::qualifier)0> local_80;
  undefined1 local_70 [8];
  vec3 dir;
  float d2;
  float d1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_50;
  undefined1 local_48 [8];
  vec3 n2;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_34;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_30;
  undefined1 local_28 [8];
  vec3 n1;
  Plane *_plane2_local;
  Plane *_plane1_local;
  
  unique0x1000021a = _plane2;
  IntersectionData::IntersectionData(__return_storage_ptr__);
  vVar5 = Plane::getNormal(_plane1);
  local_30 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar5.field_2;
  n1.field_0 = local_30;
  stack0xffffffffffffffc8 = vVar5._0_8_;
  local_28._0_4_ = n2.field_2;
  local_28._4_4_ = aStack_34;
  unique0x1000020e = vVar5;
  vVar5 = Plane::getNormal(stack0xffffffffffffffe8);
  local_50 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar5.field_2;
  n2.field_0 = local_50;
  _d2 = vVar5._0_8_;
  local_48._0_4_ = d2;
  local_48._4_4_ = d1;
  fVar3 = Plane::getDCoeff(_plane1);
  dir.field_2.z = Plane::getDCoeff(stack0xffffffffffffffe8);
  vVar5 = Plane::getNormal(_plane1);
  local_90.field_2 = vVar5.field_2;
  local_80.field_2 = local_90.field_2;
  local_90._0_8_ = vVar5._0_8_;
  local_80.field_0 = local_90.field_0;
  local_80.field_1 = local_90.field_1;
  local_90 = vVar5;
  vVar5 = Plane::getNormal(stack0xffffffffffffffe8);
  local_b0.field_2 = vVar5.field_2;
  local_a0.field_2 = local_b0.field_2;
  local_b0._0_8_ = vVar5._0_8_;
  local_a0.field_0 = local_b0.field_0;
  local_a0.field_1 = local_b0.field_1;
  vVar6 = glm::cross<float,(glm::qualifier)0>(&local_80,&local_a0);
  local_c0._0_8_ = vVar6._0_8_;
  local_70._0_4_ = local_c0.field_0;
  local_70._4_4_ = local_c0.field_1;
  local_c0.field_2 = vVar6.field_2;
  dir.field_0.x = local_c0.field_2.z;
  lVar2 = glm::vec<3,_float,_(glm::qualifier)0>::length();
  __return_storage_ptr__->hit = (double)lVar2 < 1e-10;
  if ((__return_storage_ptr__->hit & 1U) != 0) {
    vVar6 = glm::normalize<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_70);
    local_d8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar6.field_2;
    _det = vVar6._0_8_;
    dir.field_0 = local_d8;
    local_70._0_4_ = det;
    local_70._4_4_ = offDiagonal;
    fVar4 = glm::dot<3,float,(glm::qualifier)0>
                      ((vec<3,_float,_(glm::qualifier)0> *)local_28,
                       (vec<3,_float,_(glm::qualifier)0> *)local_48);
    fVar1 = 1.0 / (1.0 - fVar4 * fVar4);
    anchor.field_2.z = (fVar3 - dir.field_2.z * fVar4) * fVar1;
    anchor.field_1.y = (dir.field_2.z - fVar3 * fVar4) * fVar1;
    vVar6 = glm::normalize<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_28);
    local_128.field_2 = vVar6.field_2;
    local_118.field_2 = local_128.field_2;
    local_128._0_8_ = vVar6._0_8_;
    local_118.field_0 = local_128.field_0;
    local_118.field_1 = local_128.field_1;
    local_128 = vVar6;
    vVar6 = glm::operator*(&local_118,anchor.field_2.z);
    local_138.field_2 = vVar6.field_2;
    local_108.field_2 = local_138.field_2;
    local_138._0_8_ = vVar6._0_8_;
    local_108.field_0 = local_138.field_0;
    local_108.field_1 = local_138.field_1;
    local_138 = vVar6;
    vVar6 = glm::normalize<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_48);
    local_168.field_2 = vVar6.field_2;
    local_158.field_2 = local_168.field_2;
    local_168._0_8_ = vVar6._0_8_;
    local_158.field_0 = local_168.field_0;
    local_158.field_1 = local_168.field_1;
    vVar6 = glm::operator*(&local_158,anchor.field_1.y);
    local_178.field_2 = vVar6.field_2;
    local_148.field_2 = local_178.field_2;
    local_178._0_8_ = vVar6._0_8_;
    local_148.field_0 = local_178.field_0;
    local_148.field_1 = local_178.field_1;
    vVar6 = glm::operator+(&local_108,&local_148);
    idata = vVar6._0_8_;
    local_180 = vVar6.field_2;
    *(IntersectionData **)&__return_storage_ptr__->position = idata;
    (__return_storage_ptr__->position).field_2 = local_180;
    (__return_storage_ptr__->direction).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_70._0_4_;
    (__return_storage_ptr__->direction).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_70._4_4_;
    (__return_storage_ptr__->direction).field_2 =
         (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)dir.field_0;
  }
  return __return_storage_ptr__;
}

Assistant:

IntersectionData intersection(const Plane& _plane1, const Plane& _plane2) {
    IntersectionData idata;
    
    glm::vec3 n1 = _plane1.getNormal();
    glm::vec3 n2 = _plane2.getNormal();
    float d1 = _plane1.getDCoeff();
    float d2 = _plane2.getDCoeff();
    
    // Check if planes are parallel, if so return false:
    glm::vec3 dir= glm::cross(_plane1.getNormal(),_plane2.getNormal());
    
    idata.hit = dir.length() < EPS;

    if (idata.hit) {
        // Direction of intersection is the cross product of the two normals:
        dir = glm::normalize(dir);
        
        // Thank you Toxi!
        float offDiagonal = glm::dot(n1,n2);
        float det = 1.0 / (1 - offDiagonal * offDiagonal);
        float a = (d1 - d2 * offDiagonal) * det;
        float b = (d2 - d1 * offDiagonal) * det;
        glm::vec3 anchor = glm::normalize(n1) * a + glm::normalize(n2) * b;
        
        idata.position = anchor;
        idata.direction = dir;
    }
    
    return idata;
}